

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scpserver.c
# Opt level: O0

char * scp_source_err_base(ScpSource *scp,char *fmt,__va_list_tag *ap)

{
  SshChannel *c;
  char *__s;
  size_t len;
  char *msg;
  __va_list_tag *ap_local;
  char *fmt_local;
  ScpSource *scp_local;
  
  __s = dupvprintf(fmt,ap);
  c = scp->sc;
  len = strlen(__s);
  sshfwd_write_ext(c,true,__s,len);
  sshfwd_write_ext(scp->sc,true,"\n",1);
  return __s;
}

Assistant:

static char *scp_source_err_base(ScpSource *scp, const char *fmt, va_list ap)
{
    char *msg = dupvprintf(fmt, ap);
    sshfwd_write_ext(scp->sc, true, msg, strlen(msg));
    sshfwd_write_ext(scp->sc, true, "\012", 1);
    return msg;
}